

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_umax16_tricore(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  ushort local_44;
  uint16_t dd;
  uint16_t bb;
  long lStack_38;
  uint16_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_38 = 0; lStack_38 < oprsz_00; lStack_38 = lStack_38 + 2) {
    local_44 = *(ushort *)((long)b + lStack_38);
    if (local_44 < *(ushort *)((long)a + lStack_38)) {
      local_44 = *(ushort *)((long)a + lStack_38);
    }
    *(ushort *)((long)d + lStack_38) = local_44;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_umax16)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint16_t)) {
        uint16_t aa = *(uint16_t *)((char *)a + i);
        uint16_t bb = *(uint16_t *)((char *)b + i);
        uint16_t dd = aa > bb ? aa : bb;
        *(uint16_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}